

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall
CCheckQueueControl<FakeCheckCheckCompletion>::CCheckQueueControl
          (CCheckQueueControl<FakeCheckCheckCompletion> *this,
          CCheckQueue<FakeCheckCheckCompletion> *pqueueIn)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->pqueue = pqueueIn;
  this->fDone = false;
  if (pqueueIn == (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::mutex::lock(&(pqueueIn->m_control_mutex).super_mutex);
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CCheckQueueControl(CCheckQueue<T> * const pqueueIn) : pqueue(pqueueIn), fDone(false)
    {
        // passed queue is supposed to be unused, or nullptr
        if (pqueue != nullptr) {
            ENTER_CRITICAL_SECTION(pqueue->m_control_mutex);
        }
    }